

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_examples.c
# Opt level: O0

psa_status_t cipher_example_encrypt_decrypt_aes_ctr_multi(void)

{
  uint8_t local_1b8 [8];
  uint8_t decrypt [100];
  uint8_t local_148 [8];
  uint8_t encrypt [100];
  uint8_t local_d8 [8];
  uint8_t input [100];
  uint8_t local_68 [8];
  uint8_t iv [16];
  size_t local_50;
  size_t output_len;
  undefined1 local_40 [6];
  psa_key_handle_t key_handle;
  psa_key_attributes_t attributes;
  psa_status_t status;
  psa_algorithm_t alg;
  
  attributes.domain_parameters_size._4_4_ = 0x4c00001;
  memset(local_40,0,0x30);
  output_len._6_2_ = 0;
  local_50 = 0;
  attributes.domain_parameters_size._0_4_ = psa_generate_random(local_d8,100);
  if ((uint)attributes.domain_parameters_size == 0) {
    psa_set_key_usage_flags((psa_key_attributes_t *)local_40,0x300);
    psa_set_key_algorithm((psa_key_attributes_t *)local_40,0x4c00001);
    psa_set_key_type((psa_key_attributes_t *)local_40,0x2400);
    psa_set_key_bits((psa_key_attributes_t *)local_40,0x100);
    attributes.domain_parameters_size._0_4_ =
         psa_generate_key((psa_key_attributes_t *)local_40,
                          (psa_key_handle_t *)((long)&output_len + 6));
    if ((uint)attributes.domain_parameters_size == 0) {
      attributes.domain_parameters_size._0_4_ =
           cipher_encrypt(output_len._6_2_,0x4c00001,local_68,0x10,local_d8,100,10,local_148,100,
                          &local_50);
      if ((uint)attributes.domain_parameters_size == 0) {
        attributes.domain_parameters_size._0_4_ =
             cipher_decrypt(output_len._6_2_,0x4c00001,local_68,0x10,local_148,local_50,10,local_1b8
                            ,100,&local_50);
        if ((uint)attributes.domain_parameters_size == 0) {
          attributes.domain_parameters_size._0_4_ = memcmp(local_d8,local_1b8,100);
          if ((uint)attributes.domain_parameters_size != 0) {
            printf("\tassertion failed at %s:%d - actual:%d expected:%d\r\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/ARMmbed[P]mbed-crypto/programs/psa/crypto_examples.c"
                   ,0x114,(ulong)(uint)attributes.domain_parameters_size,0);
          }
        }
        else {
          printf("\tassertion failed at %s:%d - actual:%d expected:%d\r\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/ARMmbed[P]mbed-crypto/programs/psa/crypto_examples.c"
                 ,0x111,(ulong)(uint)attributes.domain_parameters_size,0);
        }
      }
      else {
        printf("\tassertion failed at %s:%d - actual:%d expected:%d\r\n",
               "/workspace/llm4binary/github/license_c_cmakelists/ARMmbed[P]mbed-crypto/programs/psa/crypto_examples.c"
               ,0x10c,(ulong)(uint)attributes.domain_parameters_size,0);
      }
    }
    else {
      printf("\tassertion failed at %s:%d - actual:%d expected:%d\r\n",
             "/workspace/llm4binary/github/license_c_cmakelists/ARMmbed[P]mbed-crypto/programs/psa/crypto_examples.c"
             ,0x107,(ulong)(uint)attributes.domain_parameters_size,0);
    }
  }
  else {
    printf("\tassertion failed at %s:%d - actual:%d expected:%d\r\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ARMmbed[P]mbed-crypto/programs/psa/crypto_examples.c"
           ,0xfe,(ulong)(uint)attributes.domain_parameters_size,0);
  }
  psa_destroy_key(output_len._6_2_);
  return (uint)attributes.domain_parameters_size;
}

Assistant:

static psa_status_t cipher_example_encrypt_decrypt_aes_ctr_multi( void )
{
    enum {
        block_size = PSA_BLOCK_CIPHER_BLOCK_SIZE( PSA_KEY_TYPE_AES ),
        key_bits = 256,
        input_size = 100,
        part_size = 10,
    };
    const psa_algorithm_t alg = PSA_ALG_CTR;

    psa_status_t status;
    psa_key_attributes_t attributes = PSA_KEY_ATTRIBUTES_INIT;
    psa_key_handle_t key_handle = 0;
    size_t output_len = 0;
    uint8_t iv[block_size], input[input_size], encrypt[input_size],
            decrypt[input_size];

    status = psa_generate_random( input, sizeof( input ) );
    ASSERT_STATUS( status, PSA_SUCCESS );

    psa_set_key_usage_flags( &attributes,
                             PSA_KEY_USAGE_ENCRYPT | PSA_KEY_USAGE_DECRYPT );
    psa_set_key_algorithm( &attributes, alg );
    psa_set_key_type( &attributes, PSA_KEY_TYPE_AES );
    psa_set_key_bits( &attributes, key_bits );

    status = psa_generate_key( &attributes, &key_handle );
    ASSERT_STATUS( status, PSA_SUCCESS );

    status = cipher_encrypt( key_handle, alg, iv, sizeof( iv ),
                             input, sizeof( input ), part_size,
                             encrypt, sizeof( encrypt ), &output_len );
    ASSERT_STATUS( status, PSA_SUCCESS );

    status = cipher_decrypt( key_handle, alg, iv, sizeof( iv ),
                             encrypt, output_len, part_size,
                             decrypt, sizeof( decrypt ), &output_len );
    ASSERT_STATUS( status, PSA_SUCCESS );

    status = memcmp( input, decrypt, sizeof( input ) );
    ASSERT_STATUS( status, PSA_SUCCESS );

exit:
    psa_destroy_key( key_handle );
    return( status );
}